

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Ptr * wabt::interp::Instance::Instantiate
                (Ptr *__return_storage_ptr__,Store *store,Ref module,RefVec *imports,Ptr *out_trap)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pTVar3;
  pointer pMVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pEVar7;
  pointer pEVar8;
  pointer pEVar9;
  ElemDesc *pEVar10;
  pointer pDVar11;
  DataDesc *pDVar12;
  pointer pSVar13;
  undefined8 uVar14;
  int iVar15;
  Result RVar16;
  Ref RVar17;
  pointer pRVar18;
  ulong uVar19;
  pointer *__x;
  pointer pGVar20;
  pointer pTVar21;
  pointer pSVar22;
  TableDesc *desc;
  long lVar23;
  pointer pTVar24;
  pointer pMVar25;
  pointer pGVar26;
  iterator iVar27;
  Store *store_00;
  vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *this;
  Instance *pIVar28;
  ElemDesc *desc_4;
  pointer pEVar29;
  pointer src;
  pointer src_00;
  long lVar30;
  ExportDesc *desc_3;
  ulong uVar31;
  pointer pEVar32;
  ulong uVar33;
  Ptr table;
  Ptr inst;
  Value value;
  Ref extern_ref;
  Ptr mod;
  Ptr extern_;
  Value value_1;
  anon_union_16_6_113bff37_for_Value_0 local_408;
  Index local_3f8;
  RefPtr<wabt::interp::Instance> local_3e8;
  Ptr *local_3c8;
  pointer local_3c0;
  anon_union_16_6_113bff37_for_Value_0 local_3b8;
  Index local_3a8;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_398;
  Ptr *local_380;
  RefPtr<wabt::interp::Module> local_378;
  undefined1 local_358 [16];
  undefined1 local_348 [136];
  pointer pHStack_2c0;
  TagType local_2b0;
  GlobalType local_288;
  FuncDesc local_270;
  FuncDesc local_1f8;
  FuncDesc local_180;
  FuncDesc local_108;
  MemoryType local_90;
  Ref local_68;
  TableType local_60;
  
  local_3c8 = __return_storage_ptr__;
  local_68.index = module.index;
  RefPtr<wabt::interp::Module>::RefPtr(&local_378,store,module);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            (&local_3e8,store,store,&local_68);
  pIVar1 = ((local_378.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = ((local_378.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar31 = ((long)pIVar2 - (long)pIVar1 >> 3) * -0x71c71c71c71c71c7;
  local_3c0 = (pointer)imports;
  if ((ulong)((long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar31) {
    local_358._0_8_ = local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"not enough imports!","");
    local_3a8 = 0;
    local_3b8.i64_ = 0;
    local_3b8._8_8_ = (Store *)0x0;
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              ((RefPtr<wabt::interp::Trap> *)&local_408.v128_,store,store,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
               (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_3b8.v128_
              );
    out_trap->obj_ = (Trap *)local_408.i64_;
    out_trap->store_ = (Store *)local_408._8_8_;
    out_trap->root_index_ = local_3f8;
    local_3f8 = 0;
    local_408.i64_ = 0;
    local_408._8_8_ = (Store *)0x0;
    if ((Trap *)local_3b8.i64_ != (Trap *)0x0) {
      operator_delete((void *)local_3b8.i64_,local_3a8 - local_3b8._0_8_);
    }
LAB_001b2d0e:
    if ((pointer)local_358._0_8_ != (pointer)local_348) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
    }
    local_3c8->obj_ = (Instance *)0x0;
    local_3c8->store_ = (Store *)0x0;
    local_3c8->root_index_ = 0;
  }
  else {
    local_380 = out_trap;
    if (pIVar2 != pIVar1) {
      lVar23 = 0;
      lVar30 = 0;
      do {
        pIVar1 = ((local_378.obj_)->desc_).imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              (&((((_Vector_impl *)&(local_3c0->type).super_ExternType)->super__Vector_impl_data).
                _M_start)->kind + lVar30 * 2);
        if (local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          StringPrintf_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     "invalid import \"%s.%s\"",
                     *(undefined8 *)((long)&(pIVar1->type).module._M_dataplus + lVar23),
                     *(undefined8 *)((long)&(pIVar1->type).name._M_dataplus + lVar23));
          local_3a8 = 0;
          local_3b8.i64_ = 0;
          local_3b8._8_8_ = (Store *)0x0;
          Store::
          Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                    ((RefPtr<wabt::interp::Trap> *)&local_408.v128_,store,store,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                     &local_3b8.v128_);
          local_380->obj_ = (Trap *)local_408.i64_;
          local_380->store_ = (Store *)local_408._8_8_;
          local_380->root_index_ = local_3f8;
          local_3f8 = 0;
          local_408.i64_ = 0;
          local_408._8_8_ = (Store *)0x0;
          if ((Trap *)local_3b8.i64_ != (Trap *)0x0) {
            operator_delete((void *)local_3b8.i64_,local_3a8 - local_3b8._0_8_);
          }
          goto LAB_001b2d0e;
        }
        RefPtr<wabt::interp::Extern>::RefPtr
                  ((RefPtr<wabt::interp::Extern> *)local_358,store,
                   (Ref)local_398.
                        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        iVar15 = (**(code **)(*(long *)local_358._0_8_ + 0x18))
                           (local_358._0_8_,store,(long)&(pIVar1->type).module._M_dataplus + lVar23,
                            local_380);
        if (iVar15 == 1) {
          local_3c8->obj_ = (Instance *)0x0;
          local_3c8->store_ = (Store *)0x0;
          local_3c8->root_index_ = 0;
        }
        else {
          iVar27._M_current =
               ((local_3e8.obj_)->imports_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar27._M_current ==
              ((local_3e8.obj_)->imports_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
            _M_realloc_insert<wabt::interp::Ref_const&>
                      ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                       &(local_3e8.obj_)->imports_,iVar27,(Ref *)&local_398);
          }
          else {
            (iVar27._M_current)->index =
                 (size_t)local_398.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_3e8.obj_)->imports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar27._M_current + 1;
          }
          switch(*(undefined4 *)(*(long *)((long)&(pIVar1->type).type._M_t + lVar23) + 8)) {
          case 0:
            iVar27._M_current =
                 ((local_3e8.obj_)->funcs_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar27._M_current ==
                ((local_3e8.obj_)->funcs_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3e8.obj_)->funcs_;
LAB_001b2f8f:
              std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
              _M_realloc_insert<wabt::interp::Ref_const&>(this,iVar27,(Ref *)&local_398);
            }
            else {
              (iVar27._M_current)->index =
                   (size_t)local_398.
                           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              ((local_3e8.obj_)->funcs_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar27._M_current + 1;
            }
            break;
          case 1:
            iVar27._M_current =
                 ((local_3e8.obj_)->tables_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar27._M_current ==
                ((local_3e8.obj_)->tables_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3e8.obj_)->tables_;
              goto LAB_001b2f8f;
            }
            (iVar27._M_current)->index =
                 (size_t)local_398.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_3e8.obj_)->tables_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar27._M_current + 1;
            break;
          case 2:
            iVar27._M_current =
                 ((local_3e8.obj_)->memories_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar27._M_current ==
                ((local_3e8.obj_)->memories_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3e8.obj_)->memories_;
              goto LAB_001b2f8f;
            }
            (iVar27._M_current)->index =
                 (size_t)local_398.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_3e8.obj_)->memories_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar27._M_current + 1;
            break;
          case 3:
            iVar27._M_current =
                 ((local_3e8.obj_)->globals_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar27._M_current ==
                ((local_3e8.obj_)->globals_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3e8.obj_)->globals_;
              goto LAB_001b2f8f;
            }
            (iVar27._M_current)->index =
                 (size_t)local_398.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_3e8.obj_)->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar27._M_current + 1;
            break;
          case 4:
            iVar27._M_current =
                 ((local_3e8.obj_)->tags_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar27._M_current ==
                ((local_3e8.obj_)->tags_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3e8.obj_)->tags_;
              goto LAB_001b2f8f;
            }
            (iVar27._M_current)->index =
                 (size_t)local_398.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_3e8.obj_)->tags_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar27._M_current + 1;
          }
        }
        if ((pointer)local_358._0_8_ != (pointer)0x0) {
          Store::DeleteRoot((Store *)local_358._8_8_,local_348._0_8_);
          local_358._0_8_ = (pointer)0x0;
          local_358._8_8_ = (Store *)0x0;
          local_348._0_8_ = (pointer)0x0;
        }
        if (iVar15 == 1) goto LAB_001b2d36;
        lVar30 = lVar30 + 1;
        lVar23 = lVar23 + 0x48;
      } while (uVar31 + (uVar31 == 0) != lVar30);
    }
    pGVar26 = (pointer)((local_378.obj_)->desc_).funcs.
                       super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    local_3c0 = (pointer)((local_378.obj_)->desc_).funcs.
                         super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    if (pGVar26 != local_3c0) {
      __x = &(pGVar26->init_func).locals.
             super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
      do {
        pIVar28 = local_3e8.obj_;
        RVar17 = RefPtr<wabt::interp::Instance>::ref(&local_3e8);
        local_108.type.super_ExternType.kind = *(ExternKind *)(__x + -0xb);
        local_108.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_0022c890;
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_108.type.params,
                   (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(__x + -10));
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_108.type.results,
                   (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(__x + -7));
        std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                  (&local_108.locals,
                   (vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> *)
                   (__x + -4));
        local_108.code_offset = *(u32 *)&((_Vector_impl_data *)(__x + -1))->_M_start;
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
                  (&local_108.handlers,
                   (vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
                   __x);
        local_408.ref_ = RVar17;
        Store::
        Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                  ((RefPtr<wabt::interp::DefinedFunc> *)local_358,store,store,&local_408.ref_,
                   &local_108);
        local_408.ref_ =
             RefPtr<wabt::interp::DefinedFunc>::ref((RefPtr<wabt::interp::DefinedFunc> *)local_358);
        iVar27._M_current =
             (pIVar28->funcs_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar27._M_current ==
            (pIVar28->funcs_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar28->funcs_,iVar27,&local_408.ref_);
        }
        else {
          (iVar27._M_current)->index = local_408.i64_;
          (pIVar28->funcs_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar27._M_current + 1;
        }
        if ((pointer)local_358._0_8_ != (pointer)0x0) {
          Store::DeleteRoot((Store *)local_358._8_8_,local_348._0_8_);
          local_358._0_8_ = (pointer)0x0;
          local_358._8_8_ = (Store *)0x0;
          local_348._0_8_ = (pointer)0x0;
        }
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
                  (&local_108.handlers);
        if (local_108.locals.
            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.locals.
                          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_108.locals.
                                super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.locals.
                                super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_108.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_0022c890;
        if (local_108.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.type.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.type.results.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.type.results.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_108.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.type.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.type.params.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.type.params.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pGVar26 = (pointer)(__x + 3);
        __x = __x + 0xf;
      } while (pGVar26 != local_3c0);
    }
    pTVar24 = ((local_378.obj_)->desc_).tables.
              super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar3 = ((local_378.obj_)->desc_).tables.
             super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar24 != pTVar3) {
      do {
        pIVar28 = local_3e8.obj_;
        local_60.super_ExternType.kind = (pTVar24->type).super_ExternType.kind;
        local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_0022c8d0;
        local_60._12_8_ = *(undefined8 *)&(pTVar24->type).super_ExternType.field_0xc;
        uVar14 = *(undefined8 *)&(pTVar24->type).field_0x14;
        local_60.limits._11_8_ = *(undefined8 *)((long)&(pTVar24->type).limits.max + 3);
        local_60.limits._4_7_ =
             SUB87((ulong)*(undefined8 *)((long)&(pTVar24->type).limits.initial + 3) >> 8,0);
        local_60._20_7_ = SUB87(uVar14,0);
        local_60.limits.initial._3_1_ = (undefined1)((ulong)uVar14 >> 0x38);
        Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
                  ((RefPtr<wabt::interp::Table> *)local_358,store,store,&local_60);
        local_408.ref_ = RefPtr<wabt::interp::Table>::ref((RefPtr<wabt::interp::Table> *)local_358);
        iVar27._M_current =
             (pIVar28->tables_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar27._M_current ==
            (pIVar28->tables_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar28->tables_,iVar27,&local_408.ref_);
        }
        else {
          (iVar27._M_current)->index = local_408.i64_;
          (pIVar28->tables_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar27._M_current + 1;
        }
        if ((pointer)local_358._0_8_ != (pointer)0x0) {
          Store::DeleteRoot((Store *)local_358._8_8_,local_348._0_8_);
          local_358._0_8_ = (pointer)0x0;
          local_358._8_8_ = (Store *)0x0;
          local_348._0_8_ = (pointer)0x0;
        }
        pTVar24 = pTVar24 + 1;
      } while (pTVar24 != pTVar3);
    }
    pMVar25 = ((local_378.obj_)->desc_).memories.
              super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar4 = ((local_378.obj_)->desc_).memories.
             super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar25 != pMVar4) {
      do {
        pIVar28 = local_3e8.obj_;
        local_90.super_ExternType.kind = (pMVar25->type).super_ExternType.kind;
        local_90.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_0022c910;
        local_90.limits.has_max = (pMVar25->type).limits.has_max;
        local_90.limits.is_shared = (pMVar25->type).limits.is_shared;
        local_90.limits.is_64 = (pMVar25->type).limits.is_64;
        local_90.limits._19_5_ = *(undefined5 *)&(pMVar25->type).limits.field_0x13;
        local_90.limits.initial = (pMVar25->type).limits.initial;
        local_90.limits.max = (pMVar25->type).limits.max;
        Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
                  ((RefPtr<wabt::interp::Memory> *)local_358,store,store,&local_90);
        local_408.ref_ =
             RefPtr<wabt::interp::Memory>::ref((RefPtr<wabt::interp::Memory> *)local_358);
        iVar27._M_current =
             (pIVar28->memories_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar27._M_current ==
            (pIVar28->memories_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar28->memories_,iVar27,&local_408.ref_);
        }
        else {
          (iVar27._M_current)->index = local_408.i64_;
          (pIVar28->memories_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar27._M_current + 1;
        }
        if ((pointer)local_358._0_8_ != (pointer)0x0) {
          Store::DeleteRoot((Store *)local_358._8_8_,local_348._0_8_);
          local_358._0_8_ = (pointer)0x0;
          local_358._8_8_ = (Store *)0x0;
          local_348._0_8_ = (pointer)0x0;
        }
        pMVar25 = pMVar25 + 1;
      } while (pMVar25 != pMVar4);
    }
    pGVar26 = ((local_378.obj_)->desc_).globals.
              super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pGVar20 = ((local_378.obj_)->desc_).globals.
              super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pGVar26 != pGVar20) {
      local_3c0 = pGVar20;
      do {
        local_3b8.i64_ = 0;
        local_3b8._8_8_ = (Store *)0x0;
        RVar17 = RefPtr<wabt::interp::Instance>::ref(&local_3e8);
        local_270.type.super_ExternType.kind = (pGVar26->init_func).type.super_ExternType.kind;
        local_270.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_0022c890;
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_270.type.params,&(pGVar26->init_func).type.params);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_270.type.results,&(pGVar26->init_func).type.results);
        std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                  (&local_270.locals,&(pGVar26->init_func).locals);
        local_270.code_offset = (pGVar26->init_func).code_offset;
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
                  (&local_270.handlers,&(pGVar26->init_func).handlers);
        local_408.ref_ = RVar17;
        Store::
        Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                  ((RefPtr<wabt::interp::DefinedFunc> *)local_358,store,store,&local_408.ref_,
                   &local_270);
        RVar17 = RefPtr<wabt::interp::DefinedFunc>::ref
                           ((RefPtr<wabt::interp::DefinedFunc> *)local_358);
        if ((pointer)local_358._0_8_ != (pointer)0x0) {
          Store::DeleteRoot((Store *)local_358._8_8_,local_348._0_8_);
          local_358._0_8_ = (pointer)0x0;
          local_358._8_8_ = (Store *)0x0;
          local_348._0_8_ = (pointer)0x0;
        }
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
                  (&local_270.handlers);
        if (local_270.locals.
            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_270.locals.
                          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_270.locals.
                                super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_270.locals.
                                super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_270.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_0022c890;
        if (local_270.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_270.type.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_270.type.results.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_270.type.results.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pIVar28 = (Instance *)
                  local_270.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((Instance *)
            local_270.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
            _M_impl.super__Vector_impl_data._M_start != (Instance *)0x0) {
          operator_delete(local_270.type.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_270.type.params.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_270.type.params.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        RVar16 = CallInitFunc(pIVar28,store,RVar17,(Value *)&local_3b8.v128_,local_380);
        pIVar28 = local_3e8.obj_;
        if (RVar16.enum_ == Error) {
          local_3c8->obj_ = (Instance *)0x0;
          local_3c8->store_ = (Store *)0x0;
          local_3c8->root_index_ = 0;
        }
        else {
          local_288.super_ExternType.kind =
               *(ExternKind *)
                &(((_Vector_impl *)&(pGVar26->type).super_ExternType)->super__Vector_impl_data).
                 _M_finish;
          local_288.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_0022c950;
          local_288.mut = (pGVar26->type).mut;
          local_288._12_8_ =
               *(undefined8 *)
                ((long)&(((_Vector_impl *)&(pGVar26->type).super_ExternType)->
                        super__Vector_impl_data)._M_finish + 4);
          local_408.i64_ = local_3b8.i64_;
          local_408._8_8_ = local_3b8._8_8_;
          Store::
          Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
                    ((RefPtr<wabt::interp::Global> *)local_358,store,store,&local_288,
                     (Value *)&local_408.v128_);
          local_408.ref_ =
               RefPtr<wabt::interp::Global>::ref((RefPtr<wabt::interp::Global> *)local_358);
          iVar27._M_current =
               (pIVar28->globals_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar27._M_current ==
              (pIVar28->globals_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
            _M_realloc_insert<wabt::interp::Ref>(&pIVar28->globals_,iVar27,&local_408.ref_);
          }
          else {
            (iVar27._M_current)->index = local_408.i64_;
            (pIVar28->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar27._M_current + 1;
          }
          pGVar20 = local_3c0;
          if ((pointer)local_358._0_8_ != (pointer)0x0) {
            Store::DeleteRoot((Store *)local_358._8_8_,local_348._0_8_);
            local_358._0_8_ = (pointer)0x0;
            local_358._8_8_ = (Store *)0x0;
            local_348._0_8_ = (pointer)0x0;
            pGVar20 = local_3c0;
          }
        }
        if (RVar16.enum_ == Error) goto LAB_001b2d36;
        pGVar26 = pGVar26 + 1;
      } while (pGVar26 != pGVar20);
    }
    pTVar5 = ((local_378.obj_)->desc_).tags.
             super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar6 = ((local_378.obj_)->desc_).tags.
             super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar5 != pTVar6) {
      do {
        pIVar28 = local_3e8.obj_;
        local_2b0.super_ExternType.kind = (pTVar5->type).super_ExternType.kind;
        local_2b0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__TagType_0022c990;
        local_2b0.super_ExternType._12_4_ =
             *(undefined4 *)&(pTVar5->type).super_ExternType.field_0xc;
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_2b0.signature,&(pTVar5->type).signature);
        Store::Alloc<wabt::interp::Tag,wabt::interp::Store&,wabt::interp::TagType&>
                  ((RefPtr<wabt::interp::Tag> *)local_358,store,store,&local_2b0);
        local_408.ref_ = RefPtr<wabt::interp::Tag>::ref((RefPtr<wabt::interp::Tag> *)local_358);
        iVar27._M_current =
             (pIVar28->tags_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar27._M_current ==
            (pIVar28->tags_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar28->tags_,iVar27,&local_408.ref_);
        }
        else {
          (iVar27._M_current)->index = local_408.i64_;
          (pIVar28->tags_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar27._M_current + 1;
        }
        if ((pointer)local_358._0_8_ != (pointer)0x0) {
          Store::DeleteRoot((Store *)local_358._8_8_,local_348._0_8_);
          local_358._0_8_ = (pointer)0x0;
          local_358._8_8_ = (Store *)0x0;
          local_348._0_8_ = (pointer)0x0;
        }
        local_2b0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__TagType_0022c990;
        if (local_2b0.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2b0.signature.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2b0.signature.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2b0.signature.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pTVar21 = pTVar5 + 1;
        pTVar5 = pTVar5 + 1;
      } while (pTVar21 != pTVar6);
    }
    pEVar32 = ((local_378.obj_)->desc_).exports.
              super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar7 = ((local_378.obj_)->desc_).exports.
             super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pEVar32 != pEVar7) {
      do {
        switch(((pEVar32->type).type._M_t.
                super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->kind) {
        case First:
          uVar31 = (ulong)pEVar32->index;
          pRVar18 = ((local_3e8.obj_)->funcs_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Table:
          uVar31 = (ulong)pEVar32->index;
          pRVar18 = ((local_3e8.obj_)->tables_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Memory:
          uVar31 = (ulong)pEVar32->index;
          pRVar18 = ((local_3e8.obj_)->memories_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Global:
          uVar31 = (ulong)pEVar32->index;
          pRVar18 = ((local_3e8.obj_)->globals_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Last:
          uVar31 = (ulong)pEVar32->index;
          pRVar18 = ((local_3e8.obj_)->tags_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        default:
          goto switchD_001b3809_default;
        }
        local_358._0_8_ = pRVar18[uVar31].index;
switchD_001b3809_default:
        iVar27._M_current =
             ((local_3e8.obj_)->exports_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar27._M_current ==
            ((local_3e8.obj_)->exports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
          _M_realloc_insert<wabt::interp::Ref_const&>
                    ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3e8.obj_)->exports_,iVar27,(Ref *)local_358);
        }
        else {
          (iVar27._M_current)->index = local_358._0_8_;
          ((local_3e8.obj_)->exports_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar27._M_current + 1;
        }
        pEVar32 = pEVar32 + 1;
      } while (pEVar32 != pEVar7);
    }
    pEVar29 = ((local_378.obj_)->desc_).elems.
              super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pEVar8 = ((local_378.obj_)->desc_).elems.
             super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pEVar29 != pEVar8) {
      do {
        local_358._0_8_ = pEVar29;
        std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
        emplace_back<wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                  ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                   &(local_3e8.obj_)->elems_,(ElemDesc **)local_358,&local_3e8);
        pEVar29 = pEVar29 + 1;
      } while (pEVar29 != pEVar8);
    }
    pEVar29 = (pointer)((local_378.obj_)->desc_).datas.
                       super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    pEVar8 = (pointer)((local_378.obj_)->desc_).datas.
                      super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (pEVar29 != pEVar8) {
      do {
        local_358._0_8_ = pEVar29;
        std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
        emplace_back<wabt::interp::DataDesc_const*>
                  ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                   &(local_3e8.obj_)->datas_,(DataDesc **)local_358);
        pEVar29 = (pointer)&(pEVar29->init_func).handlers.
                            super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      } while (pEVar29 != pEVar8);
    }
    local_3c0 = (pointer)(ulong)(store->features_).bulk_memory_enabled_;
    do {
      pEVar9 = ((local_3e8.obj_)->elems_).
               super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (src = ((local_3e8.obj_)->elems_).
                 super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                 ._M_impl.super__Vector_impl_data._M_start; src != pEVar9; src = src + 1) {
        pEVar10 = src->desc_;
        if (pEVar10->mode == Declared) {
          pRVar18 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish != pRVar18) {
            (src->elements_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = pRVar18;
          }
        }
        else if (pEVar10->mode == Active) {
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)&local_408.v128_,store,
                     (Ref)((local_3e8.obj_)->tables_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pEVar10->table_index].index);
          local_348._128_8_ = 0;
          pHStack_2c0 = (pointer)0x0;
          RVar17 = RefPtr<wabt::interp::Instance>::ref(&local_3e8);
          local_180.type.super_ExternType.kind = (pEVar10->init_func).type.super_ExternType.kind;
          local_180.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_0022c890;
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                    (&local_180.type.params,&(pEVar10->init_func).type.params);
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                    (&local_180.type.results,&(pEVar10->init_func).type.results);
          std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                    (&local_180.locals,&(pEVar10->init_func).locals);
          local_180.code_offset = (pEVar10->init_func).code_offset;
          std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
                    (&local_180.handlers,&(pEVar10->init_func).handlers);
          local_3b8.ref_ = RVar17;
          Store::
          Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                    ((RefPtr<wabt::interp::DefinedFunc> *)local_358,store,store,&local_3b8.ref_,
                     &local_180);
          RVar17 = RefPtr<wabt::interp::DefinedFunc>::ref
                             ((RefPtr<wabt::interp::DefinedFunc> *)local_358);
          if ((pointer)local_358._0_8_ != (pointer)0x0) {
            Store::DeleteRoot((Store *)local_358._8_8_,local_348._0_8_);
            local_358._0_8_ = (pointer)0x0;
            local_358._8_8_ = (Store *)0x0;
            local_348._0_8_ = (pointer)0x0;
          }
          std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
          ~vector(&local_180.handlers);
          if (local_180.locals.
              super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_180.locals.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_180.locals.
                                  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_180.locals.
                                  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          local_180.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_0022c890;
          if (local_180.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_180.type.results.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_180.type.results.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_180.type.results.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pIVar28 = (Instance *)
                    local_180.type.params.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((Instance *)
              local_180.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start != (Instance *)0x0) {
            operator_delete(local_180.type.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_180.type.params.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_180.type.params.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          store_00 = store;
          RVar16 = CallInitFunc(pIVar28,store,RVar17,(Value *)(local_348 + 0x80),local_380);
          if (RVar16.enum_ == Error) goto LAB_001b4248;
          uVar31 = (ulong)((long)(src->elements_).
                                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(src->elements_).
                                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3;
          uVar33 = local_348._128_8_ & 0xffffffff;
          if ((int)local_3c0 == 0) {
            uVar19 = (long)*(pointer *)(local_408.i64_ + 0x78) -
                     (long)(((RefVec *)(local_408.i64_ + 0x70))->
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3;
            uVar31 = uVar31 & 0xffffffff;
            RVar16.enum_ = (Enum)(uVar19 - uVar31 < uVar33 || uVar19 < uVar31);
          }
          else {
            RVar16 = Table::Init((Table *)local_408.i64_,store_00,local_348._128_4_,src,0,
                                 (u32)uVar31);
            if ((RVar16.enum_ == Ok) &&
               (pRVar18 = (src->elements_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start,
               (src->elements_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_finish != pRVar18)) {
              (src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = pRVar18;
            }
          }
          if (RVar16.enum_ == Error) {
            StringPrintf_abi_cxx11_
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358,
                       "out of bounds table access: elem segment is out of bounds: [%u, %lu) >= max value %u"
                       ,uVar33,((ulong)((long)(src->elements_).
                                              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(src->elements_).
                                             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3 &
                               0xffffffff) + uVar33,
                       (ulong)((long)(((Trap *)(local_408.i64_ + 0x78))->super_Object)._vptr_Object
                              - (long)(((RefVec *)(local_408.i64_ + 0x70))->
                                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3);
            local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            Store::
            Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                      ((RefPtr<wabt::interp::Trap> *)&local_3b8.v128_,store,store,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358,&local_398);
            local_380->obj_ = (Trap *)local_3b8.i64_;
            local_380->store_ = (Store *)local_3b8._8_8_;
            local_380->root_index_ = local_3a8;
            local_3a8 = 0;
            local_3b8.i64_ = 0;
            local_3b8._8_8_ = (Store *)0x0;
            if (local_398.
                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_398.
                              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_398.
                                    super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_398.
                                    super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((pointer)local_358._0_8_ != (pointer)local_348) {
              operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
            }
            local_3c8->obj_ = (Instance *)0x0;
            local_3c8->store_ = (Store *)0x0;
            local_3c8->root_index_ = 0;
          }
          if ((Memory *)local_408.i64_ != (Memory *)0x0) {
            Store::DeleteRoot((Store *)local_408._8_8_,local_3f8);
            local_408.i64_ = 0;
            local_408._8_8_ = (Store *)0x0;
            local_3f8 = 0;
          }
          if (RVar16.enum_ == Error) goto LAB_001b2d36;
        }
      }
      pDVar11 = ((local_3e8.obj_)->datas_).
                super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src_00 = ((local_3e8.obj_)->datas_).
                    super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_start; src_00 != pDVar11;
          src_00 = src_00 + 1) {
        pDVar12 = src_00->desc_;
        if (pDVar12->mode == Declared) {
          src_00->size_ = 0;
        }
        else if (pDVar12->mode == Active) {
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)&local_408.v128_,store,
                     (Ref)((local_3e8.obj_)->memories_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pDVar12->memory_index].index);
          local_348._128_8_ = 0;
          pHStack_2c0 = (pointer)0x0;
          RVar17 = RefPtr<wabt::interp::Instance>::ref(&local_3e8);
          local_1f8.type.super_ExternType.kind = (pDVar12->init_func).type.super_ExternType.kind;
          local_1f8.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_0022c890;
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                    (&local_1f8.type.params,&(pDVar12->init_func).type.params);
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                    (&local_1f8.type.results,&(pDVar12->init_func).type.results);
          std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                    (&local_1f8.locals,&(pDVar12->init_func).locals);
          local_1f8.code_offset = (pDVar12->init_func).code_offset;
          std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
                    (&local_1f8.handlers,&(pDVar12->init_func).handlers);
          local_3b8.ref_ = RVar17;
          Store::
          Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                    ((RefPtr<wabt::interp::DefinedFunc> *)local_358,store,store,&local_3b8.ref_,
                     &local_1f8);
          RVar17 = RefPtr<wabt::interp::DefinedFunc>::ref
                             ((RefPtr<wabt::interp::DefinedFunc> *)local_358);
          if ((pointer)local_358._0_8_ != (pointer)0x0) {
            Store::DeleteRoot((Store *)local_358._8_8_,local_348._0_8_);
            local_358._0_8_ = (pointer)0x0;
            local_358._8_8_ = (Store *)0x0;
            local_348._0_8_ = (pointer)0x0;
          }
          std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
          ~vector(&local_1f8.handlers);
          if (local_1f8.locals.
              super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.locals.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1f8.locals.
                                  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f8.locals.
                                  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          local_1f8.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_0022c890;
          if (local_1f8.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.type.results.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f8.type.results.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f8.type.results.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pIVar28 = (Instance *)
                    local_1f8.type.params.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((Instance *)
              local_1f8.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start != (Instance *)0x0) {
            operator_delete(local_1f8.type.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f8.type.params.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f8.type.params.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          RVar16 = CallInitFunc(pIVar28,store,RVar17,(Value *)(local_348 + 0x80),local_380);
          if (RVar16.enum_ == Error) goto LAB_001b4248;
          uVar31 = local_348._128_8_;
          if (*(bool *)(local_408.i64_ + 0x62) == false) {
            uVar31 = local_348._128_8_ & 0xffffffff;
          }
          uVar33 = src_00->size_;
          if ((int)local_3c0 == 0) {
            uVar19 = (long)*(pointer *)(local_408.i64_ + 0x70) -
                     (long)(((Buffer *)(local_408.i64_ + 0x68))->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start;
            RVar16.enum_ = (Enum)(uVar19 < uVar33 + uVar31 || (uVar19 < uVar33 || uVar19 < uVar31));
          }
          else {
            RVar16 = Memory::Init((Memory *)local_408.i64_,uVar31,src_00,0,uVar33);
            if (RVar16.enum_ == Ok) {
              src_00->size_ = 0;
            }
          }
          if (RVar16.enum_ == Error) {
            StringPrintf_abi_cxx11_
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358,
                       "out of bounds memory access: data segment is out of bounds: [%lu, %lu) >= max value %lu"
                       ,uVar31,src_00->size_ + uVar31,
                       (long)(((RefVec *)(local_408.i64_ + 0x70))->
                             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                             )._M_impl.super__Vector_impl_data._M_start -
                       (long)(((Buffer *)(local_408.i64_ + 0x68))->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start);
            local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            Store::
            Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                      ((RefPtr<wabt::interp::Trap> *)&local_3b8.v128_,store,store,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358,&local_398);
            local_380->obj_ = (Trap *)local_3b8.i64_;
            local_380->store_ = (Store *)local_3b8._8_8_;
            local_380->root_index_ = local_3a8;
            local_3a8 = 0;
            local_3b8.i64_ = 0;
            local_3b8._8_8_ = (Store *)0x0;
            if (local_398.
                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_398.
                              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_398.
                                    super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_398.
                                    super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((pointer)local_358._0_8_ != (pointer)local_348) {
              operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
            }
            local_3c8->obj_ = (Instance *)0x0;
            local_3c8->store_ = (Store *)0x0;
            local_3c8->root_index_ = 0;
          }
          if ((Memory *)local_408.i64_ != (Memory *)0x0) {
            Store::DeleteRoot((Store *)local_408._8_8_,local_3f8);
            local_408.i64_ = 0;
            local_408._8_8_ = (Store *)0x0;
            local_3f8 = 0;
          }
          if (RVar16.enum_ == Error) goto LAB_001b2d36;
        }
      }
      iVar15 = (int)local_3c0;
      local_3c0 = (pointer)(ulong)(iVar15 + 1);
    } while (iVar15 == 0);
    pSVar22 = ((local_378.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar13 = ((local_378.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pSVar22 != pSVar13) {
      do {
        RefPtr<wabt::interp::Func>::RefPtr
                  ((RefPtr<wabt::interp::Func> *)&local_408.v128_,store,
                   (Ref)((local_3e8.obj_)->funcs_).
                        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                        _M_impl.super__Vector_impl_data._M_start[pSVar22->func_index].index);
        uVar14 = local_408.i64_;
        local_3a8 = 0;
        local_3b8.i64_ = 0;
        local_3b8._8_8_ = (Store *)0x0;
        local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        Thread::Thread((Thread *)local_358,store,(Stream *)0x0);
        iVar15 = (**(code **)(*(long *)uVar14 + 0x28))
                           (uVar14,(Thread *)local_358,&local_398,&local_3b8,local_380);
        Thread::~Thread((Thread *)local_358);
        if (local_398.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_398.
                          super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_398.
                                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_398.
                                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (iVar15 == 1) {
          local_3c8->obj_ = (Instance *)0x0;
          local_3c8->store_ = (Store *)0x0;
          local_3c8->root_index_ = 0;
          if ((Trap *)local_3b8.i64_ != (Trap *)0x0) {
            operator_delete((void *)local_3b8.i64_,local_3a8 - local_3b8._0_8_);
          }
          goto LAB_001b425b;
        }
        if ((Trap *)local_3b8.i64_ != (Trap *)0x0) {
          operator_delete((void *)local_3b8.i64_,local_3a8 - local_3b8._0_8_);
        }
        if ((Memory *)local_408.i64_ != (Memory *)0x0) {
          Store::DeleteRoot((Store *)local_408._8_8_,local_3f8);
          local_408.i64_ = 0;
          local_408._8_8_ = (Store *)0x0;
          local_3f8 = 0;
        }
        pSVar22 = pSVar22 + 1;
      } while (pSVar22 != pSVar13);
    }
    local_3c8->obj_ = local_3e8.obj_;
    local_3c8->store_ = local_3e8.store_;
    local_3c8->root_index_ = local_3e8.root_index_;
    local_3e8.obj_ = (Instance *)0x0;
    local_3e8.store_ = (Store *)0x0;
    local_3e8.root_index_ = 0;
  }
LAB_001b2d36:
  if (local_3e8.obj_ != (Instance *)0x0) {
    Store::DeleteRoot(local_3e8.store_,local_3e8.root_index_);
    local_3e8.obj_ = (Instance *)0x0;
    local_3e8.store_ = (Store *)0x0;
    local_3e8.root_index_ = 0;
  }
  if (local_378.obj_ != (Module *)0x0) {
    Store::DeleteRoot(local_378.store_,local_378.root_index_);
  }
  return local_3c8;
LAB_001b4248:
  local_3c8->obj_ = (Instance *)0x0;
  local_3c8->store_ = (Store *)0x0;
  local_3c8->root_index_ = 0;
LAB_001b425b:
  if ((Memory *)local_408.i64_ != (Memory *)0x0) {
    Store::DeleteRoot((Store *)local_408._8_8_,local_3f8);
    local_408.i64_ = 0;
    local_408._8_8_ = (Store *)0x0;
    local_3f8 = 0;
  }
  goto LAB_001b2d36;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Tag:    inst->tags_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    Value value;
    Ref func_ref = DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
    if (Failed(inst->CallInitFunc(store, func_ref, &value, out_trap))) {
      return {};
    }
    inst->globals_.push_back(Global::New(store, desc.type, value).ref());
  }

  // Tags.
  for (auto&& desc : mod->desc().tags) {
    inst->tags_.push_back(Tag::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports) {
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Tag:    ref = inst->tags_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(&desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  // The MVP requires that all segments are bounds-checked before being copied
  // into the table or memory. The bulk memory proposal changes this behavior;
  // instead, each segment is copied in order. If any segment fails, then no
  // further segments are copied. Any data that was written persists.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        Value value;
        Ref func_ref =
            DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
        if (Failed(inst->CallInitFunc(store, func_ref, &value, out_trap))) {
          return {};
        }
        u32 offset = value.Get<u32>();
        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          if (Succeeded(result)) {
            segment.Drop();
          }
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds table access: elem segment is "
                         "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                         offset, u64{offset} + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        Value offset_op;
        Ref func_ref =
            DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
        if (Failed(inst->CallInitFunc(store, func_ref, &offset_op, out_trap))) {
          return {};
        }
        u64 offset = memory->type().limits.is_64 ? offset_op.Get<u64>()
                                                 : offset_op.Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          if (Succeeded(result)) {
            segment.Drop();
          }
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds memory access: data segment is "
                         "out of bounds: [%" PRIu64 ", %" PRIu64
                         ") >= max value %" PRIu64,
                         offset, offset + segment.size(), memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}